

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O3

size_t hpa_alloc_batch(tsdn_t *tsdn,pai_t *self,size_t size,size_t nallocs,
                      edata_list_active_t *results,_Bool frequent_reuse,
                      _Bool *deferred_work_generated)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  nstime_t *pnVar3;
  uint64_t uVar4;
  char *addr;
  void *pvVar5;
  tsdn_t *tsdn_00;
  hpdata_t *addr_00;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  hpdata_t *phVar9;
  mutex_prof_data_t *data;
  malloc_mutex_t *pmVar10;
  _Bool local_62;
  _Bool local_61;
  malloc_mutex_t *local_60;
  hpdata_t *local_58;
  tsdn_t *local_50;
  pthread_mutex_t *local_48;
  malloc_mutex_t *local_40;
  edata_list_active_t *local_38;
  
  if ((0x200000 < size || !frequent_reuse) && (self[100].shrink < size)) {
    return 0;
  }
  local_62 = false;
  local_50 = tsdn;
  sVar7 = hpa_try_alloc_batch_no_grow
                    (tsdn,(hpa_shard_t *)self,size,&local_62,nallocs,results,deferred_work_generated
                    );
  if (nallocs - sVar7 == 0) {
    return nallocs;
  }
  if (local_62 != false) {
    return sVar7;
  }
  local_48 = (pthread_mutex_t *)&self[4].shrink;
  local_38 = results;
  iVar6 = pthread_mutex_trylock(local_48);
  if (iVar6 != 0) {
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&self[3].alloc_batch);
    *(undefined1 *)&self[4].expand = 1;
  }
  self[4].alloc_batch = self[4].alloc_batch + 1;
  if ((tsdn_t *)self[4].alloc != local_50) {
    self[4].alloc =
         (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)
         local_50;
    self[3].time_until_deferred_work = self[3].time_until_deferred_work + 1;
  }
  sVar8 = hpa_try_alloc_batch_no_grow
                    (local_50,(hpa_shard_t *)self,size,&local_62,nallocs - sVar7,local_38,
                     deferred_work_generated);
  sVar8 = sVar8 + sVar7;
  if ((nallocs - sVar8 == 0) || (local_62 == true)) goto LAB_01d7a2a8;
  pmVar10 = (malloc_mutex_t *)self[1].alloc;
  __mutex = (pthread_mutex_t *)((long)&pmVar10->field_0 + 0x48);
  iVar6 = pthread_mutex_trylock(__mutex);
  if (iVar6 != 0) {
    duckdb_je_malloc_mutex_lock_slow(pmVar10);
    (pmVar10->field_0).field_0.locked.repr = true;
  }
  puVar1 = &(pmVar10->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((pmVar10->field_0).field_0.prof_data.prev_owner != local_50) {
    *(tsdn_t **)((long)&pmVar10->field_0 + 0x30) = local_50;
    ppwVar2 = &(pmVar10->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  local_62 = false;
  local_60 = pmVar10;
  if (pmVar10[1].field_0.witness.name == (char *)0x0) {
    local_61 = true;
    phVar9 = (hpdata_t *)duckdb_je_pages_map((void *)0x0,0x10000000,0x200000,&local_61);
    pmVar10 = local_60;
    if (phVar9 != (hpdata_t *)0x0) {
      local_58 = phVar9;
      phVar9 = (hpdata_t *)
               duckdb_je_base_alloc(local_50,(base_t *)local_60[1].field_0.witness.comp,0xf8,0x40);
      if (phVar9 != (hpdata_t *)0x0) {
        pmVar10[1].field_0.witness.name = (char *)local_58;
        pmVar10[1].field_0.field_0.prof_data.max_wait_time.ns = 0x10000000;
        goto LAB_01d7a1c1;
      }
      duckdb_je_pages_unmap(local_58,0x10000000);
    }
LAB_01d7a297:
    (local_60->field_0).field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  else {
    local_40 = pmVar10 + 1;
    uVar4 = pmVar10[1].field_0.field_0.prof_data.max_wait_time.ns;
    phVar9 = (hpdata_t *)
             duckdb_je_base_alloc(local_50,(base_t *)pmVar10[1].field_0.witness.comp,0xf8,0x40);
    pmVar10 = local_60;
    if (uVar4 == 0x200000) {
      if (phVar9 == (hpdata_t *)0x0) goto LAB_01d7a297;
      addr = local_60[1].field_0.witness.name;
      pvVar5 = local_60[1].field_0.witness.opaque;
      local_60[1].field_0.witness.opaque = (void *)((long)pvVar5 + 1);
      local_58 = phVar9;
      duckdb_je_hpdata_init(phVar9,addr,(uint64_t)pvVar5);
      (local_40->field_0).witness.name = (char *)0x0;
      (local_40->field_0).field_0.prof_data.max_wait_time.ns = 0;
    }
    else {
      if (phVar9 == (hpdata_t *)0x0) goto LAB_01d7a297;
      local_58 = (hpdata_t *)(local_40->field_0).witness.name;
LAB_01d7a1c1:
      pvVar5 = pmVar10[1].field_0.witness.opaque;
      pmVar10[1].field_0.witness.opaque = (void *)((long)pvVar5 + 1);
      addr_00 = local_58;
      local_58 = phVar9;
      duckdb_je_hpdata_init(phVar9,addr_00,(uint64_t)pvVar5);
      pmVar10[1].field_0.witness.name = pmVar10[1].field_0.witness.name + 0x200000;
      pnVar3 = &pmVar10[1].field_0.field_0.prof_data.max_wait_time;
      pnVar3->ns = pnVar3->ns - 0x200000;
    }
    (pmVar10->field_0).field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    iVar6 = pthread_mutex_trylock((pthread_mutex_t *)&self[2].shrink);
    if (iVar6 != 0) {
      duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&self[1].alloc_batch);
      *(undefined1 *)&self[2].expand = 1;
    }
    tsdn_00 = local_50;
    self[2].alloc_batch = self[2].alloc_batch + 1;
    if ((tsdn_t *)self[2].alloc != local_50) {
      self[2].alloc =
           (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)
           local_50;
      self[1].time_until_deferred_work = self[1].time_until_deferred_work + 1;
    }
    duckdb_je_psset_insert((psset_t *)&self[5].dalloc_batch,local_58);
    *(undefined1 *)&self[2].expand = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&self[2].shrink);
    sVar7 = hpa_try_alloc_batch_no_grow
                      (tsdn_00,(hpa_shard_t *)self,size,&local_62,nallocs - sVar8,local_38,
                       deferred_work_generated);
    sVar8 = sVar8 + sVar7;
  }
LAB_01d7a2a8:
  *(undefined1 *)&self[4].expand = 0;
  pthread_mutex_unlock(local_48);
  return sVar8;
}

Assistant:

static size_t
hpa_alloc_batch(tsdn_t *tsdn, pai_t *self, size_t size, size_t nallocs,
    edata_list_active_t *results, bool frequent_reuse,
    bool *deferred_work_generated) {
	assert(nallocs > 0);
	assert((size & PAGE_MASK) == 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);
	hpa_shard_t *shard = hpa_from_pai(self);

	/*
	 * frequent_use here indicates this request comes from the arena bins,
	 * in which case it will be split into slabs, and therefore there is no
	 * intrinsic slack in the allocation (the entire range of allocated size
	 * will be accessed).
	 *
	 * In this case bypass the slab_max_alloc limit (if still within the
	 * huge page size).  These requests do not concern internal
	 * fragmentation with huge pages (again, the full size will be used).
	 */
	if (!(frequent_reuse && size <= HUGEPAGE) &&
	    (size > shard->opts.slab_max_alloc)) {
		return 0;
	}

	size_t nsuccess = hpa_alloc_batch_psset(tsdn, shard, size, nallocs,
	    results, deferred_work_generated);

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/*
	 * Guard the sanity checks with config_debug because the loop cannot be
	 * proven non-circular by the compiler, even if everything within the
	 * loop is optimized away.
	 */
	if (config_debug) {
		edata_t *edata;
		ql_foreach(edata, &results->head, ql_link_active) {
			emap_assert_mapped(tsdn, shard->emap, edata);
			assert(edata_pai_get(edata) == EXTENT_PAI_HPA);
			assert(edata_state_get(edata) == extent_state_active);
			assert(edata_arena_ind_get(edata) == shard->ind);
			assert(edata_szind_get_maybe_invalid(edata) ==
			    SC_NSIZES);
			assert(!edata_slab_get(edata));
			assert(edata_committed_get(edata));
			assert(edata_base_get(edata) == edata_addr_get(edata));
			assert(edata_base_get(edata) != NULL);
		}
	}
	return nsuccess;
}